

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O1

int mpt_connection_dispatch(mpt_connection *con,mpt_event_handler_t cmd,void *arg)

{
  mpt_buffer *pmVar1;
  byte bVar2;
  byte bVar3;
  mpt_buffer *pmVar4;
  mpt_stream *srm;
  int iVar5;
  mpt_metatype *pmVar6;
  long lVar7;
  ulong uVar8;
  ulong len;
  uint64_t id;
  mpt_msgtype hdr;
  _streamWrapper sw;
  mpt_event ev;
  mpt_message msg;
  long local_b0;
  ulong local_a8;
  undefined1 local_9a;
  undefined1 local_99;
  mpt_message local_98;
  mpt_event local_78;
  ulong local_60;
  mpt_message local_58;
  
  local_78.reply = (mpt_reply_context *)0x0;
  local_78.msg = (mpt_message *)0x0;
  local_78.id = 0;
  local_58.cont = (iovec *)0x0;
  local_58.clen = 0;
  local_58.used = 0;
  local_58.base = (void *)0x0;
  bVar2 = (con->out).state;
  if ((bVar2 & 0x10) != 0) {
    return 0x10000;
  }
  if ((con->out).sock._id < 0) {
    srm = (mpt_stream *)(con->out).buf._buf;
    if (srm != (mpt_stream *)0x0) {
      iVar5 = mpt_stream_dispatch(srm,streamWrapper,&local_98);
      return iVar5;
    }
    return -1;
  }
  if ((bVar2 & 0x20) == 0) {
    return 0x10000;
  }
  (con->out).state = bVar2 & 0xcf;
  pmVar4 = (con->out).buf._buf;
  if (pmVar4 == (mpt_buffer *)0x0) {
    if (cmd == (mpt_event_handler_t)0x0) {
      return 0;
    }
LAB_00104dde:
    iVar5 = (*cmd)(arg,&local_78);
  }
  else {
    bVar2 = (con->out)._idlen;
    uVar8 = (ulong)bVar2;
    bVar3 = (con->out)._smax;
    len = (ulong)bVar3;
    local_a8 = (ulong)((uint)bVar3 + (uint)bVar2);
    if (pmVar4->_used < local_a8) {
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%u < %u)","datagram too small",
              local_a8,pmVar4->_used & 0xffffffff);
      mpt_outdata_reply(&con->out,len,pmVar4 + 1,(mpt_message *)0x0);
    }
    else {
      if (cmd == (mpt_event_handler_t)0x0) {
        pmVar4->_used = 0;
        mpt_outdata_reply(&con->out,local_a8,pmVar4 + 1,(mpt_message *)0x0);
        return 0;
      }
      pmVar1 = pmVar4 + 1;
      if (uVar8 == 0) {
        local_78.msg = &local_98;
        local_98.cont = (iovec *)0x0;
        local_98.clen = 0;
        local_98.base = (void *)((long)&pmVar1->_vptr + local_a8);
        local_98.used = pmVar4->_used - local_a8;
        goto LAB_00104dde;
      }
      if (-1 < (char)*(byte *)&pmVar1->_vptr) {
        pmVar6 = (mpt_metatype *)0x0;
        lVar7 = 0;
        do {
          local_60 = uVar8;
          if (*(char *)((long)&pmVar1->_vptr + lVar7) != '\0') {
            pmVar6 = con->_rctx;
            if (pmVar6 == (mpt_metatype *)0x0) {
              pmVar6 = (mpt_metatype *)mpt_reply_deferrable(local_a8,replyConnection,con);
              if (pmVar6 == (mpt_metatype *)0x0) {
                pmVar6 = (mpt_metatype *)0x0;
                mpt_log(0,"mpt::connection::dispatch<mpt::output>",4,"%s: %s","dispatch incomplete",
                        "no context available");
              }
              else {
                con->_rctx = pmVar6;
              }
            }
            break;
          }
          lVar7 = lVar7 + 1;
        } while (bVar2 != (byte)lVar7);
        local_98.used = 0;
        local_b0 = 0;
        if (((pmVar6 != (mpt_metatype *)0x0) &&
            (iVar5 = (*(pmVar6->_vptr->convertable).convert)((mpt_convertable *)pmVar6,8,&local_b0),
            -1 < iVar5)) && (local_b0 != 0)) {
          (*(pmVar6->_vptr->convertable).convert)((mpt_convertable *)pmVar6,0x82,&local_98);
        }
        local_78.reply = (mpt_reply_context *)local_98.used;
        if (((mpt_reply_context *)local_98.used != (mpt_reply_context *)0x0) &&
           (iVar5 = mpt_reply_set(local_b0,local_60,pmVar1), iVar5 < 0)) {
          mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s: %s","dispatch failed",
                  "context not ready");
          return -4;
        }
        local_58.base = (void *)((long)&pmVar1->_vptr + local_a8);
        local_78.msg = &local_58;
        local_58.used = pmVar4->_used - local_a8;
        iVar5 = (*cmd)(arg,&local_78);
        if ((mpt_reply_context *)local_98.used == (mpt_reply_context *)0x0) {
          return iVar5;
        }
        if (*(short *)(local_b0 + 2) == 0) {
          return iVar5;
        }
        local_58.base = &local_9a;
        local_9a = 1;
        local_99 = (undefined1)iVar5;
        local_58.used = 2;
        local_58.cont = (iovec *)0x0;
        (*(*(_mpt_vptr_reply_context **)local_98.used)->reply)
                  ((mpt_reply_context *)local_98.used,&local_58);
        return iVar5;
      }
      local_98.cont = (iovec *)0x0;
      local_98.clen = 0;
      local_98.used = 0;
      local_98.base = (void *)0x0;
      *(byte *)&pmVar1->_vptr = *(byte *)&pmVar1->_vptr & 0x7f;
      iVar5 = mpt_message_buf2id((long)&pmVar1->_vptr + len,uVar8,&local_b0);
      if (-1 < iVar5) {
        lVar7 = mpt_command_get(&con->_wait,local_b0);
        if (lVar7 == 0) {
          mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s: %s (lx)",
                  "reply processing failed","message not registered",local_b0);
        }
        else {
          local_98.base = (void *)((long)&pmVar1->_vptr + local_a8);
          local_98.used = pmVar4->_used - local_a8;
          iVar5 = (**(code **)(lVar7 + 8))(*(undefined8 *)(lVar7 + 0x10));
          if (-1 < iVar5) {
            return 0;
          }
          mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)","reply processing failed",
                  iVar5);
        }
        return -0x11;
      }
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)","bad message length",uVar8);
      pmVar4->_used = len;
    }
    iVar5 = -2;
  }
  return iVar5;
}

Assistant:

extern int mpt_connection_dispatch(MPT_STRUCT(connection) *con, MPT_TYPE(event_handler) cmd, void *arg)
{
	static const char _func[] = "mpt::connection::dispatch<mpt::output>";
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(event) ev = MPT_EVENT_INIT;
	MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
	uint8_t *data;
	uint16_t hlen;
	uint8_t ilen, slen;
	
	/* message transfer in progress */
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_EVENTFLAG(Retry);
	}
	if (!MPT_socket_active(&con->out.sock)) {
		struct _streamWrapper sw;
		
		if (!(buf = con->out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		return mpt_stream_dispatch((void *) buf, streamWrapper, &sw);
	}
	/* no new data present */
	if (!(con->out.state & MPT_OUTFLAG(Received))) {
		return MPT_EVENTFLAG(Retry);
	}
	con->out.state &= ~MPT_OUTFLAG(Received);
	
	/* no message data */
	if (!(buf = con->out.buf._buf)) {
		return cmd ? cmd(arg, &ev) : 0;
	}
	ilen = con->out._idlen;
	slen = con->out._smax;
	hlen = ilen + slen;
	
	if ((size_t) hlen > buf->_used) {
		mpt_log(0, _func, MPT_LOG(Error), "%s (%u < %u)", MPT_tr("datagram too small"), hlen, (int) buf->_used);
		mpt_outdata_reply(&con->out, slen, buf + 1, 0);
		return MPT_ERROR(BadValue);
	}
	/* discard existing message */
	if (!cmd) {
		buf->_used = 0;
		mpt_outdata_reply(&con->out, hlen, buf + 1, 0);
		return 0;
	}
	data = (void *) (buf + 1);
	/* no message id */
	if (!ilen) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		return cmd(arg, &ev);
	}
	/* got reply message */
	if (data[0] & 0x80) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		MPT_STRUCT(command) *ans;
		uint64_t id;
		int len;
		data[0] &= 0x7f;
		if ((len = mpt_message_buf2id(data + slen, ilen, &id)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("bad message length"), (int) ilen);
			buf->_used = slen;
			return MPT_ERROR(BadValue);
		}
		if (!(ans = mpt_command_get(&con->_wait, id))) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s (" PRIx64 ")",
			        MPT_tr("reply processing failed"), MPT_tr("message not registered"), id);
			return MPT_ERROR(MissingBuffer);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		if ((len = ans->cmd(ans->arg, &msg)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("reply processing failed"), len);
			return MPT_ERROR(MissingBuffer);
		}
		return 0;
	}
	else {
		MPT_INTERFACE(metatype) *ctx = 0;
		MPT_INTERFACE(reply_context) *rc;
		MPT_STRUCT(reply_data) *rd;
		int ret;
		uint8_t i;
		
		/* need processing */
		for (i = 0; i < ilen; ++i) {
			if (!data[i]) {
				continue;
			}
			/* reply context required */
			if ((ctx = con->_rctx)) {
				break;
			}
			if (!(ctx = mpt_reply_deferrable(hlen, replyConnection, con))) {
				mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
				        MPT_tr("dispatch incomplete"), MPT_tr("no context available"));
				break;
			}
			con->_rctx = ctx;
			break;
		}
		/* get reply data and interface for reference */
		rc = 0;
		rd = 0;
		if (ctx
		    && MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyDataPtr), &rd) >= 0
		    && rd) {
			MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyPtr), &rc);
		}
		if ((ev.reply = rc) && mpt_reply_set(rd, ilen, data) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("context not ready"));
			return MPT_ERROR(BadOperation);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		
		ret = cmd(arg, &ev);
		
		if (rc && rd->len) {
			MPT_STRUCT(msgtype) hdr;
			hdr.cmd = MPT_MESGTYPE(Answer);
			hdr.arg = ret;
			msg.base = &hdr;
			msg.used = sizeof(hdr);
			msg.cont = 0;
			rc->_vptr->reply(rc, &msg);
		}
		return ret;
	}
}